

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void Fossilize::parse_attachment_base<VkAttachmentReference2>
               (VkAttachmentReference2 *ref,Value *value)

{
  Type pGVar1;
  
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"attachment");
  if ((undefined1  [16])((undefined1  [16])pGVar1->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    ref->attachment = (pGVar1->data_).s.length;
    pGVar1 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"layout");
    if ((undefined1  [16])((undefined1  [16])pGVar1->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      ref->layout = (pGVar1->data_).s.length;
      return;
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

static void parse_attachment_base(Ref &ref, const Value &value)
{
	ref.attachment = value["attachment"].GetUint();
	ref.layout = static_cast<VkImageLayout>(value["layout"].GetUint());
}